

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

PathPtr __thiscall kj::PathPtr::parent(PathPtr *this)

{
  size_t sVar1;
  PathPtr PVar2;
  Fault f;
  Fault local_10;
  
  sVar1 = (this->parts).size_;
  if (sVar1 != 0) {
    PVar2.parts.size_ = sVar1 - 1;
    PVar2.parts.ptr = (this->parts).ptr;
    return (PathPtr)PVar2.parts;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
            (&local_10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
             ,0x7b,FAILED,"parts.size() > 0","\"root path has no parent\"",
             (char (*) [24])"root path has no parent");
  _::Debug::Fault::fatal(&local_10);
}

Assistant:

void init(SymlinkNode&& value) {
      node.init<SymlinkNode>(kj::mv(value));
    }